

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,char *id,PolicyStatus status)

{
  bool bVar1;
  ostream *poVar2;
  PolicyID pid;
  string local_1b8;
  ostringstream e;
  
  bVar1 = cmPolicies::GetPolicyID(id,&pid);
  if (bVar1) {
    bVar1 = SetPolicy(this,pid,status);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,"Policy \"");
    poVar2 = std::operator<<(poVar2,id);
    std::operator<<(poVar2,"\" is not known to this version of CMake.");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmMakefile::SetPolicy(const char* id, cmPolicies::PolicyStatus status)
{
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id, /* out */ pid)) {
    std::ostringstream e;
    e << "Policy \"" << id << "\" is not known to this version of CMake.";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
  }
  return this->SetPolicy(pid, status);
}